

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule_list.hpp
# Opt level: O2

ClassicalScheduleList *
openjij::utility::make_classical_schedule_list
          (ClassicalScheduleList *__return_storage_ptr__,double beta_min,double beta_max,
          size_t one_mc_step,size_t num_call_updater)

{
  long lVar1;
  pointer pSVar2;
  Schedule<openjij::system::classical_system> *schedule;
  pointer pSVar3;
  ClassicalScheduleList *__range2;
  undefined1 auVar4 [16];
  allocator_type local_29;
  double local_28;
  double local_20;
  
  lVar1 = num_call_updater - 1;
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  local_20 = beta_min;
  local_28 = pow(beta_max / beta_min,
                 1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)));
  std::
  vector<openjij::utility::Schedule<openjij::system::classical_system>,_std::allocator<openjij::utility::Schedule<openjij::system::classical_system>_>_>
  ::vector(__return_storage_ptr__,num_call_updater,&local_29);
  pSVar2 = (__return_storage_ptr__->
           super__Vector_base<openjij::utility::Schedule<openjij::system::classical_system>,_std::allocator<openjij::utility::Schedule<openjij::system::classical_system>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (__return_storage_ptr__->
                super__Vector_base<openjij::utility::Schedule<openjij::system::classical_system>,_std::allocator<openjij::utility::Schedule<openjij::system::classical_system>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1) {
    pSVar3->one_mc_step = one_mc_step;
    (pSVar3->updater_parameter).beta = local_20;
    local_20 = local_20 * local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

ClassicalScheduleList
make_classical_schedule_list(double beta_min, double beta_max,
                             std::size_t one_mc_step,
                             std::size_t num_call_updater) {
  double r_beta = std::pow(beta_max / beta_min,
                           1.0 / static_cast<double>(num_call_updater - 1));
  double beta = beta_min;

  auto schedule_list = ClassicalScheduleList(num_call_updater);
  for (auto &schedule : schedule_list) {
    schedule.one_mc_step = one_mc_step;
    schedule.updater_parameter = ClassicalUpdaterParameter(beta);
    beta *= r_beta;
  }

  return schedule_list;
}